

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O1

void __thiscall PointAddition::test_method(PointAddition *this)

{
  Vector3d v;
  RealSpace R3;
  Point x;
  RealScalar local_3a8;
  undefined1 local_3a0;
  undefined8 local_398;
  shared_count sStack_390;
  Matrix<double,_3,_1,_0,_3,_1> *local_388;
  ulong uStack_380;
  undefined8 *local_378;
  char **local_370;
  undefined8 uStack_368;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_360;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  Matrix<double,_3,_1,_0,_3,_1> local_308;
  code *local_2f0 [11];
  void *local_298;
  void *local_288;
  undefined1 local_278 [8];
  void *pvStack_270;
  scalar_constant_op<double> local_268;
  RhsNested local_260;
  undefined8 uStack_258;
  Ref local_150 [8];
  void *local_148;
  ConstSubPoint local_138 [272];
  
  mnf::RealSpace::RealSpace((RealSpace *)local_2f0,3);
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       1.0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       2.0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       3.0;
  local_260 = (RhsNested)0x0;
  uStack_258 = 0;
  pvStack_270 = (void *)0x3;
  local_278 = (undefined1  [8])&local_308;
  mnf::Manifold::createPoint(local_150);
  free(local_260);
  local_370 = (char **)0x0;
  uStack_368 = 0;
  uStack_380 = 3;
  local_388 = &local_308;
  mnf::operator+((Point *)local_278,local_150);
  mnf::Point::operator=((Point *)local_150,(Point *)local_278);
  mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&local_260);
  free(pvStack_270);
  free(local_370);
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_318,100);
  mnf::SubPoint::value();
  local_268.m_other = 2.0;
  local_3a8 = 1e-12;
  local_260 = &local_308;
  local_3a0 = Eigen::internal::
              isApprox_selector<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_false>
              ::run(&local_360,
                    (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                     *)local_278,&local_3a8);
  local_398 = 0;
  sStack_390.pi_ = (sp_counted_base *)0x0;
  local_370 = &local_338;
  local_338 = "x.value().isApprox(2 * v)";
  local_330 = "";
  uStack_380 = uStack_380 & 0xffffffffffffff00;
  local_388 = (Matrix<double,_3,_1,_0,_3,_1> *)&PTR__lazy_ostream_00129c08;
  local_378 = &boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_340 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_390);
  mnf::ConstSubPoint::~ConstSubPoint(local_138);
  free(local_148);
  local_2f0[0] = mnf::operator+;
  free(local_288);
  free(local_298);
  mnf::Manifold::~Manifold((Manifold *)local_2f0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(PointAddition)
{
  RealSpace R3(3);
  Eigen::Vector3d v(1, 2, 3);

  Point x = R3.createPoint(v);
  x = x + v;
  BOOST_CHECK(x.value().isApprox(2 * v));
}